

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::PatchPutValueCheckLayout<Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               PropertyOperationFlags flags)

{
  bool bVar1;
  DynamicObject *pDVar2;
  DynamicTypeHandler *pDVar3;
  DynamicTypeHandler *pDVar4;
  
  bVar1 = VarIs<Js::DynamicObject>(instance);
  if (bVar1) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject>(instance);
    pDVar3 = DynamicObject::GetTypeHandler(pDVar2);
    PatchPutValueWithThisPtr<true,Js::PolymorphicInlineCache>
              (functionBody,inlineCache,inlineCacheIndex,instance,propertyId,newValue,instance,flags
              );
    if (pDVar3 != (DynamicTypeHandler *)0x0) {
      pDVar2 = UnsafeVarTo<Js::DynamicObject>(instance);
      pDVar4 = DynamicObject::GetTypeHandler(pDVar2);
      if (pDVar4 != pDVar3) {
        if (pDVar3->inlineSlotCapacity != pDVar4->inlineSlotCapacity) {
          return true;
        }
        return pDVar3->offsetOfInlineSlots != pDVar4->offsetOfInlineSlots;
      }
    }
  }
  else {
    PatchPutValueWithThisPtr<true,Js::PolymorphicInlineCache>
              (functionBody,inlineCache,inlineCacheIndex,instance,propertyId,newValue,instance,flags
              );
  }
  return false;
}

Assistant:

inline bool JavascriptOperators::PatchPutValueCheckLayout(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutValueCheckLayout);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchPutValueCheckLayout, Op_PatchPutValue);

        DynamicTypeHandler * oldTypeHandler = VarIs<DynamicObject>(instance) ? UnsafeVarTo<DynamicObject>(instance)->GetTypeHandler() : nullptr;
        PatchPutValueWithThisPtr<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, instance, propertyId, newValue, instance, flags);
        return (oldTypeHandler != nullptr && LayoutChanged(UnsafeVarTo<DynamicObject>(instance), oldTypeHandler));

        JIT_HELPER_END(Op_PatchPutValueCheckLayout);
    }